

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O3

SVInt __thiscall slang::SVInt::lshr(SVInt *this,bitwidth_t amount)

{
  bool bVar1;
  uint bits;
  uint64_t *puVar2;
  ulong uVar3;
  uint numWords;
  uint64_t *dst;
  byte bVar4;
  uint in_EDX;
  undefined8 extraout_RDX;
  uint64_t value;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar5;
  undefined4 in_register_00000034;
  SVIntStorage *other;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  bool bVar9;
  SVInt SVar10;
  
  other = (SVIntStorage *)CONCAT44(in_register_00000034,amount);
  if (in_EDX == 0) {
    SVInt(this,other);
    uVar5 = extraout_RDX;
  }
  else {
    bits = other->bitWidth;
    if (in_EDX < bits) {
      bVar9 = other->unknownFlag;
      bVar4 = (byte)in_EDX;
      if (0x40 < bits || (bVar9 & 1U) != 0) {
        bVar1 = other->signFlag;
        numWords = bits + 0x3f >> 6;
        iVar7 = numWords << (bVar9 & 0x1fU);
        uVar6 = (ulong)(uint)(iVar7 * 8);
        dst = (uint64_t *)operator_new__(uVar6);
        memset(dst,0,uVar6);
        (this->super_SVIntStorage).field_0.pVal = dst;
        (this->super_SVIntStorage).bitWidth = bits;
        (this->super_SVIntStorage).signFlag = bVar1;
        (this->super_SVIntStorage).unknownFlag = bVar9;
        if (in_EDX < 0x40 && (bVar9 & 1U) == 0) {
          if (0x3f < bits + 0x3f) {
            puVar2 = (other->field_0).pVal;
            uVar8 = (ulong)(iVar7 - 1);
            uVar6 = 0;
            do {
              uVar3 = puVar2[uVar8];
              dst[uVar8] = uVar3 >> (bVar4 & 0x3f) | uVar6;
              bVar9 = uVar8 != 0;
              uVar8 = uVar8 - 1;
              uVar6 = uVar3 << (0x40 - bVar4 & 0x3f);
            } while (bVar9);
          }
        }
        else {
          puVar2 = (other->field_0).pVal;
          lshrFar(dst,puVar2,in_EDX & 0x3f,in_EDX >> 6,0,numWords);
          if ((bVar9 & 1U) != 0) {
            lshrFar(dst,puVar2,in_EDX & 0x3f,in_EDX >> 6,numWords,numWords);
          }
        }
        checkUnknown(this);
        uVar5 = extraout_RDX_01;
        goto LAB_002b9bd5;
      }
      value = (other->field_0).val >> (bVar4 & 0x3f);
      bVar9 = other->signFlag;
    }
    else {
      bVar9 = other->signFlag;
      value = 0;
    }
    SVInt(this,bits,value,bVar9);
    uVar5 = extraout_RDX_00;
  }
LAB_002b9bd5:
  SVar10.super_SVIntStorage.bitWidth = (int)uVar5;
  SVar10.super_SVIntStorage.signFlag = (bool)(char)((ulong)uVar5 >> 0x20);
  SVar10.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)uVar5 >> 0x28);
  SVar10.super_SVIntStorage._14_2_ = (short)((ulong)uVar5 >> 0x30);
  SVar10.super_SVIntStorage.field_0.pVal = (uint64_t *)this;
  return (SVInt)SVar10.super_SVIntStorage;
}

Assistant:

SVInt SVInt::lshr(bitwidth_t amount) const {
    // handle trivial cases
    if (amount == 0)
        return *this;
    if (amount >= bitWidth) // if the shift amount is too large, we end up with zero anyway
        return SVInt(bitWidth, 0, signFlag);
    if (isSingleWord())
        return SVInt(bitWidth, val >> amount, signFlag);

    // handle the small shift case
    SVInt result = allocZeroed(bitWidth, signFlag, unknownFlag);
    if (amount < BITS_PER_WORD && !unknownFlag)
        lshrNear(result.pVal, pVal, getNumWords(), amount);
    else {
        // otherwise do a full shift
        uint32_t numWords = getNumWords(bitWidth, false);
        uint32_t wordShift = amount % BITS_PER_WORD;
        uint32_t offset = amount / BITS_PER_WORD;

        // also handle shifting the unknown bits if necessary
        lshrFar(result.pVal, pVal, wordShift, offset, 0, numWords);
        if (unknownFlag)
            lshrFar(result.pVal, pVal, wordShift, offset, numWords, numWords);
    }

    result.checkUnknown();
    return result;
}